

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

bool __thiscall
helics::FederateState::checkAndSetValue
          (FederateState *this,InterfaceHandle pub_id,char *data,uint64_t len)

{
  bool bVar1;
  PublicationInfo *this_00;
  
  sleeplock(this);
  this_00 = InterfaceInfo::getPublication(&this->interfaceInformation,pub_id);
  bVar1 = PublicationInfo::CheckSetValue
                    (this_00,data,len,(Time)(this->time_granted).internalTimeCode,
                     this->only_transmit_on_change);
  LOCK();
  (this->processing).super___atomic_flag_base._M_i = false;
  UNLOCK();
  return bVar1;
}

Assistant:

bool FederateState::checkAndSetValue(InterfaceHandle pub_id, const char* data, uint64_t len)
{
    const std::lock_guard<FederateState> plock(*this);
    // this function could be called externally in a multi-threaded context
    auto* pub = interfaceInformation.getPublication(pub_id);
    auto res = pub->CheckSetValue(data, len, time_granted, only_transmit_on_change);
    return res;
}